

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_TestMemoryAccountant_reportAllocations_TestShell::createTest
          (TEST_TestMemoryAccountant_reportAllocations_TestShell *this)

{
  TEST_TestMemoryAccountant_reportAllocations_Test *this_00;
  TEST_TestMemoryAccountant_reportAllocations_TestShell *this_local;
  
  this_00 = (TEST_TestMemoryAccountant_reportAllocations_Test *)
            operator_new(0x68,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
                         ,0x1b2);
  TEST_TestMemoryAccountant_reportAllocations_Test::TEST_TestMemoryAccountant_reportAllocations_Test
            (this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(TestMemoryAccountant, reportAllocations)
{
    accountant.dealloc(8);
    accountant.dealloc(8);
    accountant.dealloc(8);

    accountant.alloc(4);
    accountant.dealloc(4);
    accountant.alloc(4);
    STRCMP_EQUAL("CppUTest Memory Accountant report:\n"
                 "Allocation size     # allocations    # deallocations   max # allocations at one time\n"
                 "    4                   2                1                 1\n"
                 "    8                   0                3                 0\n"
                 "   Thank you for your business\n"
                 , accountant.report().asCharString());
}